

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall
Json::Path::Path(Path *this,string *path,PathArgument *a1,PathArgument *a2,PathArgument *a3,
                PathArgument *a4,PathArgument *a5)

{
  InArgs in;
  PathArgument *local_50;
  InArgs local_48;
  
  (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (PathArgument **)0x0;
  local_48.
  super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (PathArgument **)0x0;
  local_50 = a1;
  std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
  _M_realloc_insert<Json::PathArgument_const*>
            ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)
             &local_48,(iterator)0x0,&local_50);
  if (local_48.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_50 = a2;
    std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
    _M_realloc_insert<Json::PathArgument_const*>
              ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)
               &local_48,
               (iterator)
               local_48.
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_50);
  }
  else {
    *local_48.
     super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = a2;
    local_48.
    super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_48.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_50 = a3;
    std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
    _M_realloc_insert<Json::PathArgument_const*>
              ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)
               &local_48,
               (iterator)
               local_48.
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_50);
  }
  else {
    *local_48.
     super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = a3;
    local_48.
    super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_48.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_50 = a4;
    std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
    _M_realloc_insert<Json::PathArgument_const*>
              ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)
               &local_48,
               (iterator)
               local_48.
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_50);
  }
  else {
    *local_48.
     super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = a4;
    local_48.
    super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_50 = a5;
  if (local_48.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>>::
    _M_realloc_insert<Json::PathArgument_const*>
              ((vector<Json::PathArgument_const*,std::allocator<Json::PathArgument_const*>> *)
               &local_48,
               (iterator)
               local_48.
               super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_50);
  }
  else {
    *local_48.
     super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = a5;
    local_48.
    super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_48.
         super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  makePath(this,path,&local_48);
  if (local_48.
      super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Path::Path(const std::string& path,
           const PathArgument& a1,
           const PathArgument& a2,
           const PathArgument& a3,
           const PathArgument& a4,
           const PathArgument& a5) {
  InArgs in;
  in.push_back(&a1);
  in.push_back(&a2);
  in.push_back(&a3);
  in.push_back(&a4);
  in.push_back(&a5);
  makePath(path, in);
}